

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O2

void __thiscall CItems::RenderPickup(CItems *this,CNetObj_Pickup *pPrev,CNetObj_Pickup *pCurrent)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  IGraphics *pIVar6;
  CGameClient *pCVar7;
  vec2 Pos;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar12;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_48;
  
  pIVar6 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar6->super_IInterface)._vptr_IInterface[0x13])
            (pIVar6,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  pCVar7 = (this->super_CComponent).m_pClient;
  uVar2 = pPrev->m_X;
  uVar4 = pPrev->m_Y;
  uVar3 = pCurrent->m_X;
  uVar5 = pCurrent->m_Y;
  fVar9 = pCVar7->m_pClient->m_GameIntraTick;
  local_48.x = fVar9 * ((float)(int)uVar3 - (float)(int)uVar2) + (float)(int)uVar2;
  aVar12.y = fVar9 * ((float)(int)uVar5 - (float)(int)uVar4) + (float)(int)uVar4;
  CRenderTools::SelectSprite
            (&pCVar7->m_RenderTools,*(int *)(&DAT_001c9ef0 + (long)pCurrent->m_Type * 4),0,0,0);
  switch(pCurrent->m_Type) {
  case 2:
    fVar9 = (float)(g_pData->m_Weapons).m_aId[3].m_VisualSize;
    break;
  case 3:
    fVar9 = (float)(g_pData->m_Weapons).m_aId[2].m_VisualSize;
    break;
  case 4:
    fVar9 = (float)(g_pData->m_Weapons).m_aId[4].m_VisualSize;
    break;
  case 5:
    Pos.field_1.y = aVar12.y;
    Pos.field_0.x = local_48.x;
    CEffects::PowerupShine
              (((this->super_CComponent).m_pClient)->m_pEffects,Pos,(vec2)0x4190000042c00000);
    local_48.x = local_48.x + -10.0;
    fVar9 = 128.0;
    break;
  case 6:
    fVar9 = (float)(g_pData->m_Weapons).m_aId[1].m_VisualSize;
    break;
  case 7:
    fVar9 = (float)((g_pData->m_Weapons).m_aId)->m_VisualSize;
    break;
  default:
    fVar9 = 64.0;
  }
  fVar1 = ((this->super_CComponent).m_pClient)->m_pClient->m_LocalTime;
  if ((RenderPickup(CNetObj_Pickup_const*,CNetObj_Pickup_const*)::s_LastLocalTime == '\0') &&
     (iVar8 = __cxa_guard_acquire(&RenderPickup(CNetObj_Pickup_const*,CNetObj_Pickup_const*)::
                                   s_LastLocalTime), iVar8 != 0)) {
    RenderPickup::s_LastLocalTime = fVar1;
    __cxa_guard_release(&RenderPickup(CNetObj_Pickup_const*,CNetObj_Pickup_const*)::s_LastLocalTime)
    ;
  }
  fVar10 = fVar1 - RenderPickup::s_LastLocalTime;
  fVar11 = CGameClient::GetAnimationPlaybackSpeed((this->super_CComponent).m_pClient);
  RenderPickup::s_Time = fVar11 * fVar10 + RenderPickup::s_Time;
  fVar11 = aVar12.y * 0.03125 + local_48.x * 0.03125;
  fVar10 = cosf(RenderPickup::s_Time + RenderPickup::s_Time + fVar11);
  fVar11 = sinf(RenderPickup::s_Time + RenderPickup::s_Time + fVar11);
  RenderPickup::s_LastLocalTime = fVar1;
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(0)
  ;
  CRenderTools::DrawSprite
            (&((this->super_CComponent).m_pClient)->m_RenderTools,fVar10 * 2.5 + local_48.x,
             fVar11 * 2.5 + aVar12.y,fVar9);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  return;
}

Assistant:

void CItems::RenderPickup(const CNetObj_Pickup *pPrev, const CNetObj_Pickup *pCurrent)
{
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();
	vec2 Pos = mix(vec2(pPrev->m_X, pPrev->m_Y), vec2(pCurrent->m_X, pCurrent->m_Y), Client()->IntraGameTick());
	float Size = 64.0f;
	const int aSprites[] = {
		SPRITE_PICKUP_HEALTH,
		SPRITE_PICKUP_ARMOR,
		SPRITE_PICKUP_GRENADE,
		SPRITE_PICKUP_SHOTGUN,
		SPRITE_PICKUP_LASER,
		SPRITE_PICKUP_NINJA,
		SPRITE_PICKUP_GUN,
		SPRITE_PICKUP_HAMMER
	};
	RenderTools()->SelectSprite(aSprites[pCurrent->m_Type]);

	switch(pCurrent->m_Type)
	{
	case PICKUP_GRENADE:
		Size = g_pData->m_Weapons.m_aId[WEAPON_GRENADE].m_VisualSize;
		break;
	case PICKUP_SHOTGUN:
		Size = g_pData->m_Weapons.m_aId[WEAPON_SHOTGUN].m_VisualSize;
		break;
	case PICKUP_LASER:
		Size = g_pData->m_Weapons.m_aId[WEAPON_LASER].m_VisualSize;
		break;
	case PICKUP_NINJA:
		m_pClient->m_pEffects->PowerupShine(Pos, vec2(96,18));
		Size *= 2.0f;
		Pos.x -= 10.0f;
		break;
	case PICKUP_GUN:
		Size = g_pData->m_Weapons.m_aId[WEAPON_GUN].m_VisualSize;
		break;
	case PICKUP_HAMMER:
		Size = g_pData->m_Weapons.m_aId[WEAPON_HAMMER].m_VisualSize;
		break;
	}

	const float Now = Client()->LocalTime();
	static float s_Time = 0.0f;
	static float s_LastLocalTime = Now;
	s_Time += (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
	const float Offset = Pos.y/32.0f + Pos.x/32.0f;
	Pos.x += cosf(s_Time*2.0f+Offset)*2.5f;
	Pos.y += sinf(s_Time*2.0f+Offset)*2.5f;
	s_LastLocalTime = Now;

	Graphics()->QuadsSetRotation(0.0f);
	RenderTools()->DrawSprite(Pos.x, Pos.y, Size);
	Graphics()->QuadsEnd();
}